

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_storage.cpp
# Opt level: O0

void __thiscall
cppcms::impl::mem_cache<cppcms::impl::process_settings>::clear
          (mem_cache<cppcms::impl::process_settings> *this)

{
  wrlock_guard lock;
  mem_cache<cppcms::impl::process_settings> *in_stack_ffffffffffffffe0;
  shared_mutex *in_stack_ffffffffffffffe8;
  unique_guard *in_stack_fffffffffffffff0;
  
  std::unique_ptr<cppcms::impl::shared_mutex,_std::default_delete<cppcms::impl::shared_mutex>_>::
  operator*((unique_ptr<cppcms::impl::shared_mutex,_std::default_delete<cppcms::impl::shared_mutex>_>
             *)in_stack_ffffffffffffffe0);
  shared_mutex::unique_guard::unique_guard(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  nl_clear(in_stack_ffffffffffffffe0);
  shared_mutex::unique_guard::~unique_guard((unique_guard *)in_stack_ffffffffffffffe0);
  return;
}

Assistant:

virtual void clear()
	{
		wrlock_guard lock(*access_lock);
		nl_clear();
	}